

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-decomposition.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  BoolVector wrap_00;
  CoordinateVector ghosts_00;
  DivisionsVector divs;
  ostream *poVar1;
  int rank;
  CoordinateVector ghosts;
  pointer piStack_1c0;
  BoolVector share_face;
  BoolVector wrap;
  vector<bool,_std::allocator<bool>_> local_168;
  vector<bool,_std::allocator<bool>_> local_140;
  code *local_118 [2];
  code *local_108;
  code *pcStack_100;
  void *local_f8;
  undefined8 uStack_f0;
  long local_e8;
  vector<int,_std::allocator<int>_> local_d8;
  ContiguousAssigner assigner;
  Bounds domain;
  
  assigner.super_StaticAssigner.super_Assigner.size_ = 8;
  assigner.super_StaticAssigner.super_Assigner.nblocks_ = 0x20;
  assigner.super_StaticAssigner.super_Assigner._vptr_Assigner =
       (_func_int **)&PTR__Assigner_001188c0;
  diy::Bounds<int>::Bounds(&domain,3);
  domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[2] = 0;
  domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 0;
  domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 0;
  domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[2] = 0xff;
  domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 0xff;
  domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 0xff;
  rank = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Rank ",5);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rank);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._M_offset = 0;
    share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    std::vector<bool,_std::allocator<bool>_>::push_back(&share_face,true);
    wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    std::vector<bool,_std::allocator<bool>_>::push_back(&wrap,true);
    std::vector<bool,_std::allocator<bool>_>::push_back(&wrap,true);
    ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_118[0]._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&ghosts,(iterator)0x0,(int *)((_Any_data *)local_118)->_M_pod_data);
    local_118[0] = (code *)CONCAT44(local_118[0]._4_4_,2);
    if (ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&ghosts,(iterator)
                         ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,
                 (int *)((_Any_data *)local_118)->_M_pod_data);
    }
    else {
      *ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = 2;
      ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
           = ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish + 1;
    }
    local_118[1] = (code *)0x0;
    local_118[0] = create;
    pcStack_100 = std::
                  _Function_handler<void_(int,_diy::Bounds<int>,_diy::Bounds<int>,_diy::Bounds<int>,_diy::RegularLink<diy::Bounds<int>_>),_void_(*)(int,_const_diy::Bounds<int>_&,_const_diy::Bounds<int>_&,_const_diy::Bounds<int>_&,_const_diy::Link_&)>
                  ::_M_invoke;
    local_108 = std::
                _Function_handler<void_(int,_diy::Bounds<int>,_diy::Bounds<int>,_diy::Bounds<int>,_diy::RegularLink<diy::Bounds<int>_>),_void_(*)(int,_const_diy::Bounds<int>_&,_const_diy::Bounds<int>_&,_const_diy::Bounds<int>_&,_const_diy::Link_&)>
                ::_M_manager;
    std::vector<bool,_std::allocator<bool>_>::vector(&local_140,&share_face);
    std::vector<bool,_std::allocator<bool>_>::vector(&local_168,&wrap);
    std::vector<int,_std::allocator<int>_>::vector(&local_d8,&ghosts);
    local_f8 = (void *)0x0;
    uStack_f0 = 0;
    local_e8 = 0;
    wrap_00.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ = &local_d8;
    wrap_00.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)&local_168;
    wrap_00.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)&local_f8;
    wrap_00.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ = 0x103eda;
    wrap_00.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage =
         (_Bit_pointer)
         ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
    ghosts_00.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage;
    ghosts_00.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
    ghosts_00.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piStack_1c0;
    divs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
    _0_4_ = share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_offset;
    divs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    divs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
    _4_4_ = share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._12_4_;
    divs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    diy::decompose<diy::Bounds<int>>
              (3,rank,&domain,&assigner.super_StaticAssigner,(Creator *)local_118,&local_140,wrap_00
               ,ghosts_00,divs);
    if (local_f8 != (void *)0x0) {
      operator_delete(local_f8,local_e8 - (long)local_f8);
    }
    if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_140.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_108 != (code *)0x0) {
      (*local_108)((_Any_data *)local_118,(_Any_data *)local_118,__destroy_functor);
    }
    if (ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_offset = 0;
      wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    rank = rank + 1;
  } while (rank != 8);
  domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  return 0;
}

Assistant:

int main(int, char* [])
{
  int                       size    = 8;
  int                       nblocks = 32;
  diy::ContiguousAssigner   assigner(size, nblocks);
  //diy::RoundRobinAssigner   assigner(size, nblocks);

  Bounds domain(3);
  domain.min[0] = domain.min[1] = domain.min[2] = 0;
  domain.max[0] = domain.max[1] = domain.max[2] = 255;
  //domain.max[0] = domain.max[1] = domain.max[2] = 128;

  for (int rank = 0; rank < size; ++ rank)
  {
    std::cout << "Rank " << rank << ":" << std::endl;

    // share_face is an n-dim (size 3 in this example) vector of bools
    // indicating whether faces are shared in each dimension
    // uninitialized values default to false
    diy::RegularDecomposer<Bounds>::BoolVector          share_face;
    share_face.push_back(true);

    // wrap is an n-dim (size 3 in this example) vector of bools
    // indicating whether boundary conditions are periodic in each dimension
    // uninitialized values default to false
    diy::RegularDecomposer<Bounds>::BoolVector          wrap;
    wrap.push_back(true);
    wrap.push_back(true);

    // ghosts is an n-dim (size 3 in this example) vector of ints
    // indicating number of ghost cells per side in each dimension
    // uninitialized values default to 0
    diy::RegularDecomposer<Bounds>::CoordinateVector    ghosts;
    ghosts.push_back(1); ghosts.push_back(2);

    diy::decompose(3, rank, domain, assigner, create, share_face, wrap, ghosts);
  }
}